

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::BlobProto::SerializeWithCachedSizes(BlobProto *this,CodedOutputStream *output)

{
  uint uVar1;
  int32 iVar2;
  int iVar3;
  RepeatedField<float> *pRVar4;
  float *pfVar5;
  RepeatedField<double> *pRVar6;
  double *pdVar7;
  UnknownFieldSet *unknown_fields;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  BlobProto *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    iVar2 = num(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,iVar2,output);
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = channels(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(2,iVar2,output);
  }
  if ((uVar1 & 8) != 0) {
    iVar2 = height(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(3,iVar2,output);
  }
  if ((uVar1 & 0x10) != 0) {
    iVar2 = width(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(4,iVar2,output);
  }
  iVar3 = data_size(this);
  if (0 < iVar3) {
    google::protobuf::internal::WireFormatLite::WriteTag(5,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_data_cached_byte_size_);
    pRVar4 = data(this);
    pfVar5 = google::protobuf::RepeatedField<float>::data(pRVar4);
    iVar3 = data_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(pfVar5,iVar3,output);
  }
  iVar3 = diff_size(this);
  if (0 < iVar3) {
    google::protobuf::internal::WireFormatLite::WriteTag(6,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_diff_cached_byte_size_);
    pRVar4 = diff(this);
    pfVar5 = google::protobuf::RepeatedField<float>::data(pRVar4);
    iVar3 = diff_size(this);
    google::protobuf::internal::WireFormatLite::WriteFloatArray(pfVar5,iVar3,output);
  }
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray
              (7,(MessageLite *)this->shape_,output);
  }
  iVar3 = double_data_size(this);
  if (0 < iVar3) {
    google::protobuf::internal::WireFormatLite::WriteTag(8,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_double_data_cached_byte_size_);
    pRVar6 = double_data(this);
    pdVar7 = google::protobuf::RepeatedField<double>::data(pRVar6);
    iVar3 = double_data_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar7,iVar3,output);
  }
  iVar3 = double_diff_size(this);
  if (0 < iVar3) {
    google::protobuf::internal::WireFormatLite::WriteTag(9,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_double_diff_cached_byte_size_);
    pRVar6 = double_diff(this);
    pdVar7 = google::protobuf::RepeatedField<double>::data(pRVar6);
    iVar3 = double_diff_size(this);
    google::protobuf::internal::WireFormatLite::WriteDoubleArray(pdVar7,iVar3,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = BlobProto::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void BlobProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.BlobProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 num = 1 [default = 0];
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->num(), output);
  }

  // optional int32 channels = 2 [default = 0];
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->channels(), output);
  }

  // optional int32 height = 3 [default = 0];
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->height(), output);
  }

  // optional int32 width = 4 [default = 0];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->width(), output);
  }

  // repeated float data = 5 [packed = true];
  if (this->data_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_data_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->data().data(), this->data_size(), output);
  }

  // repeated float diff = 6 [packed = true];
  if (this->diff_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_diff_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->diff().data(), this->diff_size(), output);
  }

  // optional .caffe.BlobShape shape = 7;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, *this->shape_, output);
  }

  // repeated double double_data = 8 [packed = true];
  if (this->double_data_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(8, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_double_data_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->double_data().data(), this->double_data_size(), output);
  }

  // repeated double double_diff = 9 [packed = true];
  if (this->double_diff_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(9, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_double_diff_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->double_diff().data(), this->double_diff_size(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.BlobProto)
}